

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O3

bool __thiscall
SslUdpSocketImpl::CreateServerSide
          (SslUdpSocketImpl *this,char *szIpToWhere,uint16_t sPort,char *szIpToBind)

{
  bool bVar1;
  SslConnection *pSVar2;
  pointer __p;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  bVar1 = UdpSocketImpl::Create(&this->super_UdpSocketImpl,szIpToWhere,sPort,szIpToBind);
  if (bVar1) {
    pSVar2 = (SslConnection *)operator_new(0x70);
    OpenSSLWrapper::SslConnection::SslConnection(pSVar2,&(this->m_pUdpCtx).super_SslContext);
    local_50._M_unused._M_object = (void *)0x0;
    std::
    __uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
    ::reset((__uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             *)&this->m_pSslCon,pSVar2);
    std::
    unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
    ~unique_ptr((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 *)&local_50);
    pSVar2 = (this->m_pSslCon)._M_t.
             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ._M_t.
             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl;
    local_50._8_8_ = 0;
    local_50._M_unused._M_object = operator_new(0x18);
    *(undefined8 *)local_50._M_unused._0_8_ = 0x11;
    *(undefined8 *)((long)local_50._M_unused._0_8_ + 8) = 0;
    *(SslUdpSocketImpl **)((long)local_50._M_unused._0_8_ + 0x10) = this;
    local_38 = std::
               _Function_handler<void_(),_std::_Bind<void_(BaseSocketImpl::*(SslUdpSocketImpl_*))()>_>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(),_std::_Bind<void_(BaseSocketImpl::*(SslUdpSocketImpl_*))()>_>
               ::_M_manager;
    OpenSSLWrapper::SslConnection::SetErrorCb(pSVar2,(function<void_()> *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    OpenSSLWrapper::SslConnection::SSLSetAcceptState
              ((this->m_pSslCon)._M_t.
               super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
  }
  return bVar1;
}

Assistant:

bool SslUdpSocketImpl::CreateServerSide(const char* const szIpToWhere, const uint16_t sPort, const char* const szIpToBind/* = nullptr*/)
{
    const bool bRet = UdpSocketImpl::Create(szIpToWhere, sPort, szIpToBind);
    if (bRet == true)
    {
        m_pSslCon = make_unique<SslConnection>(m_pUdpCtx);
        m_pSslCon->SetErrorCb(function<void()>(bind(&BaseSocketImpl::Close, this)));

        //SSL_set_info_callback((*m_pSslCon)(), ssl_info_callbackServer);

        m_pSslCon->SSLSetAcceptState();
    }
    return bRet;
}